

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O1

void __thiscall
icu_63::DecimalFormat::DecimalFormat
          (DecimalFormat *this,UnicodeString *pattern,DecimalFormatSymbols *symbols,
          UErrorCode *status)

{
  DecimalFormatSymbols *this_00;
  
  this_00 = (DecimalFormatSymbols *)UMemory::operator_new((UMemory *)0xb00,(size_t)pattern);
  if (this_00 == (DecimalFormatSymbols *)0x0) {
    this_00 = (DecimalFormatSymbols *)0x0;
  }
  else {
    DecimalFormatSymbols::DecimalFormatSymbols(this_00,symbols);
  }
  DecimalFormat(this,this_00,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    icu_63::number::impl::PatternParser::parseToExistingProperties
              (pattern,(this->fields->properties).
                       super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr,
               IGNORE_ROUNDING_IF_CURRENCY,status);
  }
  touch(this,status);
  return;
}

Assistant:

DecimalFormat::DecimalFormat(const UnicodeString& pattern, const DecimalFormatSymbols& symbols,
                             UErrorCode& status)
        : DecimalFormat(new DecimalFormatSymbols(symbols), status) {
    setPropertiesFromPattern(pattern, IGNORE_ROUNDING_IF_CURRENCY, status);
    touch(status);
}